

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_color_quantize.cpp
# Opt level: O3

bool try_quantize_rgb_blue_contract
               (vfloat4 color0,vfloat4 color1,vint4 *color0_out,vint4 *color1_out,
               quant_method quant_level)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar7 [16];
  
  auVar11._8_56_ = color0._16_56_;
  auVar11._0_8_ = color0.m._8_8_;
  auVar9._8_56_ = color0._8_56_;
  auVar9._0_8_ = color0.m._0_8_;
  auVar7 = auVar9._0_16_;
  auVar10 = vshufps_avx(auVar7,auVar7,0xea);
  auVar10 = vsubps_avx(auVar7,auVar10);
  auVar12._0_4_ = auVar10._0_4_ + color0.m[0];
  auVar12._4_4_ = auVar10._4_4_ + color0.m[1];
  auVar12._8_4_ = auVar10._8_4_ + color0.m[2];
  auVar12._12_4_ = auVar10._12_4_ + color0.m[3];
  auVar7 = auVar11._0_16_;
  auVar10 = vshufps_avx(auVar7,auVar7,0xea);
  auVar10 = vsubps_avx(auVar7,auVar10);
  auVar8._0_4_ = auVar10._0_4_ + color0.m[2];
  auVar8._4_4_ = auVar10._4_4_ + color0.m[3];
  auVar8._8_4_ = auVar10._8_4_ + color0._16_4_;
  auVar8._12_4_ = auVar10._12_4_ + color0._20_4_;
  auVar10 = vcmpps_avx(auVar12,ZEXT816(0) << 0x40,1);
  auVar15._8_4_ = 0x437f0000;
  auVar15._0_8_ = 0x437f0000437f0000;
  auVar15._12_4_ = 0x437f0000;
  auVar7 = vcmpps_avx(auVar15,auVar12,1);
  auVar13 = vcmpps_avx(auVar8,ZEXT816(0) << 0x40,1);
  auVar13 = vorps_avx(auVar10,auVar13);
  auVar10 = vcmpps_avx(auVar15,auVar8,1);
  auVar10 = vorps_avx(auVar7,auVar10);
  auVar10 = vorps_avx(auVar10,auVar13);
  if ((((auVar10 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar10 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar10 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar10[0xf]) {
    auVar13._0_4_ = (int)(auVar12._0_4_ + 0.5);
    auVar13._4_4_ = (int)(auVar12._4_4_ + 0.5);
    auVar13._8_4_ = (int)(auVar12._8_4_ + 0.5);
    auVar13._12_4_ = (int)(auVar12._12_4_ + 0.5);
    auVar7 = vpaddd_avx(auVar13,auVar13);
    auVar10 = vcvtdq2ps_avx(auVar13);
    auVar10 = vsubps_avx(auVar12,auVar10);
    auVar14._8_4_ = 0xbdcccccd;
    auVar14._0_8_ = 0xbdcccccdbdcccccd;
    auVar14._12_4_ = 0xbdcccccd;
    auVar10 = vcmpps_avx(auVar14,auVar10,2);
    auVar13 = vpsubd_avx(auVar7,auVar10);
    uVar5 = quant_level - QUANT_6;
    bVar1 = color_unquant_to_uquant_tables[uVar5][auVar13._0_4_];
    bVar2 = color_unquant_to_uquant_tables[uVar5][auVar13._4_4_];
    auVar10._0_4_ = (int)(auVar8._0_4_ + 0.5);
    auVar10._4_4_ = (int)(auVar8._4_4_ + 0.5);
    auVar10._8_4_ = (int)(auVar8._8_4_ + 0.5);
    auVar10._12_4_ = (int)(auVar8._12_4_ + 0.5);
    auVar7 = vpaddd_avx(auVar10,auVar10);
    auVar10 = vcvtdq2ps_avx(auVar10);
    auVar10 = vsubps_avx(auVar8,auVar10);
    auVar10 = vcmpps_avx(auVar14,auVar10,2);
    auVar10 = vpsubd_avx(auVar7,auVar10);
    bVar3 = color_unquant_to_uquant_tables[uVar5][auVar10._0_4_];
    bVar4 = color_unquant_to_uquant_tables[uVar5][auVar10._4_4_];
    uVar6 = (uint)color_unquant_to_uquant_tables[uVar5][auVar10._8_4_];
    uVar5 = (uint)color_unquant_to_uquant_tables[uVar5][auVar13._8_4_];
    if ((uint)bVar2 + (uint)bVar1 + uVar5 < (uint)bVar4 + (uint)bVar3 + uVar6) {
      auVar10 = vpunpckldq_avx(ZEXT116(bVar3),ZEXT116(bVar4));
      auVar7 = vpunpcklqdq_avx(auVar10,ZEXT416(uVar6));
      auVar10 = vpunpckldq_avx(ZEXT116(bVar1),ZEXT116(bVar2));
      auVar10 = vpunpcklqdq_avx(auVar10,ZEXT416(uVar5));
      *(undefined1 (*) [16])color0_out->m = auVar7;
      *(undefined1 (*) [16])color1_out->m = auVar10;
      return true;
    }
  }
  return false;
}

Assistant:

static bool try_quantize_rgb_blue_contract(
	vfloat4 color0,
	vfloat4 color1,
	vint4& color0_out,
	vint4& color1_out,
	quant_method quant_level
) {
	// Apply inverse blue-contraction
	color0 += color0 - color0.swz<2, 2, 2, 3>();
	color1 += color1 - color1.swz<2, 2, 2, 3>();

	// If anything overflows BC cannot be used
	vmask4 color0_error = (color0 < vfloat4(0.0f)) | (color0 > vfloat4(255.0f));
	vmask4 color1_error = (color1 < vfloat4(0.0f)) | (color1 > vfloat4(255.0f));
	if (any(color0_error | color1_error))
	{
		return false;
	}

	// Quantize the inverse blue-contracted color
	vint4 color0i = quant_color3(quant_level, float_to_int_rtn(color0), color0);
	vint4 color1i = quant_color3(quant_level, float_to_int_rtn(color1), color1);

	// If color #1 is not larger than color #0 then blue-contraction cannot be used
	// We must test afterwards because quantization can change the order
	if (hadd_rgb_s(color1i) <= hadd_rgb_s(color0i))
	{
		return false;
	}

	color0_out = color1i;
	color1_out = color0i;
	return true;
}